

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushFont(ImFont *font)

{
  long in_RDI;
  ImFont *unaff_retaddr;
  ImGuiContext *g;
  ImFont **in_stack_ffffffffffffffe8;
  ImGuiContext *this;
  
  this = GImGui;
  if (in_RDI == 0) {
    GetDefaultFont();
  }
  SetCurrentFont(unaff_retaddr);
  ImVector<ImFont_*>::push_back((ImVector<ImFont_*> *)this,in_stack_ffffffffffffffe8);
  ImDrawList::PushTextureID((ImDrawList *)this,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void ImGui::PushFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    if (!font)
        font = GetDefaultFont();
    SetCurrentFont(font);
    g.FontStack.push_back(font);
    g.CurrentWindow->DrawList->PushTextureID(font->ContainerAtlas->TexID);
}